

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* flatbuffers::(anonymous_namespace)::RustKeywords_abi_cxx11_(void)

{
  long lVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_9ee;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_9ed;
  allocator<char> local_9ec;
  allocator<char> local_9eb;
  allocator<char> local_9ea;
  allocator<char> local_9e9;
  allocator<char> local_9e8;
  allocator<char> local_9e7;
  allocator<char> local_9e6;
  allocator<char> local_9e5;
  allocator<char> local_9e4;
  allocator<char> local_9e3;
  allocator<char> local_9e2;
  allocator<char> local_9e1;
  allocator<char> local_9e0;
  allocator<char> local_9df;
  allocator<char> local_9de;
  allocator<char> local_9dd;
  allocator<char> local_9dc;
  allocator<char> local_9db;
  allocator<char> local_9da;
  allocator<char> local_9d9;
  allocator<char> local_9d8;
  allocator<char> local_9d7;
  allocator<char> local_9d6;
  allocator<char> local_9d5;
  allocator<char> local_9d4;
  allocator<char> local_9d3;
  allocator<char> local_9d2;
  allocator<char> local_9d1;
  allocator<char> local_9d0;
  allocator<char> local_9cf;
  allocator<char> local_9ce;
  allocator<char> local_9cd;
  allocator<char> local_9cc;
  allocator<char> local_9cb;
  allocator<char> local_9ca;
  allocator<char> local_9c9;
  allocator<char> local_9c8;
  allocator<char> local_9c7;
  allocator<char> local_9c6;
  allocator<char> local_9c5;
  allocator<char> local_9c4;
  allocator<char> local_9c3;
  allocator<char> local_9c2;
  allocator<char> local_9c1;
  allocator<char> local_9c0;
  allocator<char> local_9bf;
  allocator<char> local_9be;
  allocator<char> local_9bd;
  allocator<char> local_9bc;
  allocator<char> local_9bb;
  allocator<char> local_9ba;
  allocator<char> local_9b9;
  allocator<char> local_9b8;
  allocator<char> local_9b7;
  allocator<char> local_9b6;
  allocator<char> local_9b5;
  allocator<char> local_9b4;
  allocator<char> local_9b3;
  allocator<char> local_9b2;
  allocator<char> local_9b1;
  allocator<char> local_9b0;
  allocator<char> local_9af;
  allocator<char> local_9ae;
  allocator<char> local_9ad;
  allocator<char> local_9ac;
  allocator<char> local_9ab;
  allocator<char> local_9aa;
  allocator<char> local_9a9;
  allocator<char> local_9a8;
  allocator<char> local_9a7;
  allocator<char> local_9a6;
  allocator<char> local_9a5;
  allocator<char> local_9a4;
  allocator<char> local_9a3;
  allocator<char> local_9a2;
  allocator<char> local_9a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"as",&local_9a1);
  std::__cxx11::string::string<std::allocator<char>>(local_980,"break",&local_9a2);
  std::__cxx11::string::string<std::allocator<char>>(local_960,"const",&local_9a3);
  std::__cxx11::string::string<std::allocator<char>>(local_940,"continue",&local_9a4);
  std::__cxx11::string::string<std::allocator<char>>(local_920,"crate",&local_9a5);
  std::__cxx11::string::string<std::allocator<char>>(local_900,"else",&local_9a6);
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"enum",&local_9a7);
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,"extern",&local_9a8);
  std::__cxx11::string::string<std::allocator<char>>(local_8a0,"false",&local_9a9);
  std::__cxx11::string::string<std::allocator<char>>(local_880,"fn",&local_9aa);
  std::__cxx11::string::string<std::allocator<char>>(local_860,"for",&local_9ab);
  std::__cxx11::string::string<std::allocator<char>>(local_840,"if",&local_9ac);
  std::__cxx11::string::string<std::allocator<char>>(local_820,"impl",&local_9ad);
  std::__cxx11::string::string<std::allocator<char>>(local_800,"in",&local_9ae);
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"let",&local_9af);
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"loop",&local_9b0);
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,"match",&local_9b1);
  std::__cxx11::string::string<std::allocator<char>>(local_780,"mod",&local_9b2);
  std::__cxx11::string::string<std::allocator<char>>(local_760,"move",&local_9b3);
  std::__cxx11::string::string<std::allocator<char>>(local_740,"mut",&local_9b4);
  std::__cxx11::string::string<std::allocator<char>>(local_720,"pub",&local_9b5);
  std::__cxx11::string::string<std::allocator<char>>(local_700,"ref",&local_9b6);
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"return",&local_9b7);
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"Self",&local_9b8);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"self",&local_9b9);
  std::__cxx11::string::string<std::allocator<char>>(local_680,"static",&local_9ba);
  std::__cxx11::string::string<std::allocator<char>>(local_660,"struct",&local_9bb);
  std::__cxx11::string::string<std::allocator<char>>(local_640,"super",&local_9bc);
  std::__cxx11::string::string<std::allocator<char>>(local_620,"trait",&local_9bd);
  std::__cxx11::string::string<std::allocator<char>>(local_600,"true",&local_9be);
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"type",&local_9bf);
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"unsafe",&local_9c0);
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"use",&local_9c1);
  std::__cxx11::string::string<std::allocator<char>>(local_580,"where",&local_9c2);
  std::__cxx11::string::string<std::allocator<char>>(local_560,"while",&local_9c3);
  std::__cxx11::string::string<std::allocator<char>>(local_540,"abstract",&local_9c4);
  std::__cxx11::string::string<std::allocator<char>>(local_520,"alignof",&local_9c5);
  std::__cxx11::string::string<std::allocator<char>>(local_500,"become",&local_9c6);
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"box",&local_9c7);
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"do",&local_9c8);
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"final",&local_9c9);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"macro",&local_9ca);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"offsetof",&local_9cb);
  std::__cxx11::string::string<std::allocator<char>>(local_440,"override",&local_9cc);
  std::__cxx11::string::string<std::allocator<char>>(local_420,"priv",&local_9cd);
  std::__cxx11::string::string<std::allocator<char>>(local_400,"proc",&local_9ce);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"pure",&local_9cf);
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"sizeof",&local_9d0);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"typeof",&local_9d1);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"unsized",&local_9d2);
  std::__cxx11::string::string<std::allocator<char>>(local_360,"virtual",&local_9d3);
  std::__cxx11::string::string<std::allocator<char>>(local_340,"yield",&local_9d4);
  std::__cxx11::string::string<std::allocator<char>>(local_320,"std",&local_9d5);
  std::__cxx11::string::string<std::allocator<char>>(local_300,"usize",&local_9d6);
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"isize",&local_9d7);
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"u8",&local_9d8);
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"i8",&local_9d9);
  std::__cxx11::string::string<std::allocator<char>>(local_280,"u16",&local_9da);
  std::__cxx11::string::string<std::allocator<char>>(local_260,"i16",&local_9db);
  std::__cxx11::string::string<std::allocator<char>>(local_240,"u32",&local_9dc);
  std::__cxx11::string::string<std::allocator<char>>(local_220,"i32",&local_9dd);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"u64",&local_9de);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"i64",&local_9df);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"u128",&local_9e0);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"i128",&local_9e1);
  std::__cxx11::string::string<std::allocator<char>>(local_180,"f32",&local_9e2);
  std::__cxx11::string::string<std::allocator<char>>(local_160,"f64",&local_9e3);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"follow",&local_9e4);
  std::__cxx11::string::string<std::allocator<char>>(local_120,"push",&local_9e5);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"size",&local_9e6);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"alignment",&local_9e7);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"to_little_endian",&local_9e8);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"from_little_endian",&local_9e9);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"ENUM_MAX",&local_9ea);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"ENUM_MIN",&local_9eb);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"ENUM_VALUES",&local_9ec);
  __l._M_len = 0x4c;
  __l._M_array = &local_9a0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_RDI,__l,&local_9ed,&local_9ee);
  lVar1 = 0x960;
  do {
    std::__cxx11::string::~string((string *)((long)&local_9a0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return in_RDI;
}

Assistant:

static std::set<std::string> RustKeywords() {
  return {
    // https://doc.rust-lang.org/book/second-edition/appendix-01-keywords.html
    "as",
    "break",
    "const",
    "continue",
    "crate",
    "else",
    "enum",
    "extern",
    "false",
    "fn",
    "for",
    "if",
    "impl",
    "in",
    "let",
    "loop",
    "match",
    "mod",
    "move",
    "mut",
    "pub",
    "ref",
    "return",
    "Self",
    "self",
    "static",
    "struct",
    "super",
    "trait",
    "true",
    "type",
    "unsafe",
    "use",
    "where",
    "while",
    // future possible keywords
    "abstract",
    "alignof",
    "become",
    "box",
    "do",
    "final",
    "macro",
    "offsetof",
    "override",
    "priv",
    "proc",
    "pure",
    "sizeof",
    "typeof",
    "unsized",
    "virtual",
    "yield",
    // other rust terms we should not use
    "std",
    "usize",
    "isize",
    "u8",
    "i8",
    "u16",
    "i16",
    "u32",
    "i32",
    "u64",
    "i64",
    "u128",
    "i128",
    "f32",
    "f64",
    // Terms that we use ourselves
    "follow",
    "push",
    "size",
    "alignment",
    "to_little_endian",
    "from_little_endian",
    "ENUM_MAX",
    "ENUM_MIN",
    "ENUM_VALUES",
  };
}